

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_tec(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *edge_faces;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT id;
  REF_INT geom;
  FILE *file;
  REF_GEOM ref_geom;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  file = (FILE *)ref_grid->geom;
  ref_geom = (REF_GEOM)filename;
  filename_local = (char *)ref_grid;
  _id = fopen(filename,"w");
  if (_id == (FILE *)0x0) {
    printf("unable to open %s\n",ref_geom);
  }
  if (_id == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xdf6,
           "ref_geom_tec","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(_id,"title=\"refine cad coupling in tecplot format\"\n");
    fprintf(_id,"variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n");
    edge_faces._4_4_ = 0x7fffffff;
    edge_faces._0_4_ = -0x80000000;
    for (min_id = 0; min_id < *(int *)&file->field_0x4; min_id = min_id + 1) {
      if (*(int *)(file->_IO_read_end + (long)(min_id * 6) * 4) == 1) {
        if (edge_faces._4_4_ < *(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4)) {
          local_68 = edge_faces._4_4_;
        }
        else {
          local_68 = *(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4);
        }
        edge_faces._4_4_ = local_68;
        if (*(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4) < (int)edge_faces) {
          local_6c = (int)edge_faces;
        }
        else {
          local_6c = *(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4);
        }
        edge_faces._0_4_ = local_6c;
      }
    }
    for (max_id = edge_faces._4_4_; max_id <= (int)edge_faces; max_id = max_id + 1) {
      uVar1 = ref_geom_edge_tec_zone((REF_GRID)filename_local,max_id,(FILE *)_id);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe05,"ref_geom_tec",(ulong)uVar1,"tec edge");
        return uVar1;
      }
    }
    if (file->_offset != 0) {
      uVar1 = ref_egads_edge_faces((REF_GEOM)file,(REF_INT **)&ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe08,"ref_geom_tec",(ulong)uVar1,"edge faces");
        return uVar1;
      }
      for (max_id = edge_faces._4_4_; max_id <= (int)edge_faces; max_id = max_id + 1) {
        if (_ref_private_macro_code_rss_1[(max_id + -1) * 2] ==
            _ref_private_macro_code_rss_1[(max_id + -1) * 2 + 1]) {
          uVar1 = ref_geom_pcrv_tec_zone
                            ((REF_GRID)filename_local,max_id,
                             _ref_private_macro_code_rss_1[(max_id + -1) * 2],1,(FILE *)_id);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xe0e,"ref_geom_tec",(ulong)uVar1,"tec pcrv");
            return uVar1;
          }
          uVar1 = ref_geom_pcrv_tec_zone
                            ((REF_GRID)filename_local,max_id,
                             _ref_private_macro_code_rss_1[(max_id + -1) * 2 + 1],-1,(FILE *)_id);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xe11,"ref_geom_tec",(ulong)uVar1,"tec pcrv");
            return uVar1;
          }
        }
        else {
          if ((_ref_private_macro_code_rss_1[(max_id + -1) * 2] != -1) &&
             (uVar1 = ref_geom_pcrv_tec_zone
                                ((REF_GRID)filename_local,max_id,
                                 _ref_private_macro_code_rss_1[(max_id + -1) * 2],0,(FILE *)_id),
             uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xe16,"ref_geom_tec",(ulong)uVar1,"tec pcrv");
            return uVar1;
          }
          if ((_ref_private_macro_code_rss_1[(max_id + -1) * 2 + 1] != -1) &&
             (uVar1 = ref_geom_pcrv_tec_zone
                                ((REF_GRID)filename_local,max_id,
                                 _ref_private_macro_code_rss_1[(max_id + -1) * 2 + 1],0,(FILE *)_id)
             , uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xe1a,"ref_geom_tec",(ulong)uVar1,"tec pcrv");
            return uVar1;
          }
        }
      }
      if (_ref_private_macro_code_rss_1 != (REF_INT *)0x0) {
        free(_ref_private_macro_code_rss_1);
      }
    }
    edge_faces._4_4_ = 0x7fffffff;
    edge_faces._0_4_ = -0x80000000;
    for (min_id = 0; min_id < *(int *)&file->field_0x4; min_id = min_id + 1) {
      if (*(int *)(file->_IO_read_end + (long)(min_id * 6) * 4) == 2) {
        if (edge_faces._4_4_ < *(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4)) {
          local_70 = edge_faces._4_4_;
        }
        else {
          local_70 = *(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4);
        }
        edge_faces._4_4_ = local_70;
        if (*(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4) < (int)edge_faces) {
          local_74 = (int)edge_faces;
        }
        else {
          local_74 = *(int *)(file->_IO_read_end + (long)(min_id * 6 + 1) * 4);
        }
        edge_faces._0_4_ = local_74;
      }
    }
    for (max_id = edge_faces._4_4_; max_id <= (int)edge_faces; max_id = max_id + 1) {
      uVar1 = ref_geom_face_tec_zone((REF_GRID)filename_local,max_id,(FILE *)_id);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe28,"ref_geom_tec",(ulong)uVar1,"tec face");
        return uVar1;
      }
    }
    fclose(_id);
    ref_grid_local._4_4_ = 0;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;
  REF_INT *edge_faces;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_edge_tec_zone(ref_grid, id, file), "tec edge");

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_edge_faces(ref_geom, &edge_faces), "edge faces");
    for (id = min_id; id <= max_id; id++) {
      if (edge_faces[0 + 2 * (id - 1)] ==
          edge_faces[1 + 2 * (id - 1)]) { /* edge used twice by face */
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                   1, file),
            "tec pcrv");
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                   -1, file),
            "tec pcrv");
      } else { /* edge used by two faces */
        if (REF_EMPTY != edge_faces[0 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
        if (REF_EMPTY != edge_faces[1 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
      }
    }
    ref_free(edge_faces);
  }

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_face_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}